

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

string * extractFileName2(string *__return_storage_ptr__,string *src,bool withExt)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  long *local_48 [2];
  long local_38 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (src->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + src->_M_string_length);
  cVar4 = (char)__return_storage_ptr__;
  lVar2 = std::__cxx11::string::rfind(cVar4,0x2e);
  lVar3 = std::__cxx11::string::rfind(cVar4,0x2f);
  if (lVar3 == -1) {
    lVar3 = std::__cxx11::string::rfind(cVar4,0x5c);
  }
  if (lVar2 != -1 && !withExt) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string extractFileName2(const string& src, const bool withExt)
{
    string fileName = src;

    const size_t extSep = fileName.find_last_of('.');
    size_t dirSep = fileName.find_last_of('/');

    if (dirSep == string::npos)
        dirSep = fileName.find_last_of('\\');

    if (extSep != string::npos && !withExt)
        fileName = fileName.substr(0, extSep);

    if (dirSep != string::npos)
        fileName = fileName.substr(dirSep + 1, fileName.size());

    return fileName;
}